

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

hwaddr flatview_extend_translation
                 (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,hwaddr target_len,
                 MemoryRegion_conflict *mr,hwaddr base,hwaddr len,_Bool is_write,MemTxAttrs attrs)

{
  MemoryRegion_conflict *pMVar1;
  MemoryRegion_conflict *this_mr;
  hwaddr xlat;
  hwaddr done;
  hwaddr hStack_48;
  _Bool is_write_local;
  hwaddr base_local;
  MemoryRegion_conflict *mr_local;
  hwaddr target_len_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  uc_local._4_4_ = attrs;
  done._7_1_ = is_write;
  xlat = 0;
  hStack_48 = base;
  base_local = (hwaddr)mr;
  mr_local = (MemoryRegion_conflict *)target_len;
  target_len_local = addr;
  addr_local = (hwaddr)fv;
  fv_local = (FlatView *)uc;
  do {
    mr_local = (MemoryRegion_conflict *)((long)mr_local - len);
    target_len_local = len + target_len_local;
    xlat = len + xlat;
    if (mr_local == (MemoryRegion_conflict *)0x0) {
      return xlat;
    }
    len = (hwaddr)mr_local;
    pMVar1 = flatview_translate_tricore
                       ((uc_struct_conflict15 *)fv_local,(FlatView *)addr_local,target_len_local,
                        (hwaddr *)&this_mr,&len,(_Bool)(done._7_1_ & 1),uc_local._4_4_);
  } while ((pMVar1 == (MemoryRegion_conflict *)base_local) &&
          (this_mr == (MemoryRegion_conflict *)(hStack_48 + xlat)));
  return xlat;
}

Assistant:

static hwaddr
flatview_extend_translation(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                            hwaddr target_len,
                            MemoryRegion *mr, hwaddr base, hwaddr len,
                            bool is_write, MemTxAttrs attrs)
{
    hwaddr done = 0;
    hwaddr xlat;
    MemoryRegion *this_mr;

    for (;;) {
        target_len -= len;
        addr += len;
        done += len;
        if (target_len == 0) {
            return done;
        }

        len = target_len;
        this_mr = flatview_translate(uc, fv, addr, &xlat,
                                     &len, is_write, attrs);
        if (this_mr != mr || xlat != base + done) {
            return done;
        }
    }
}